

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-server.c
# Opt level: O0

int OpenSSL_verify_callback(int preverify_ok,X509_STORE_CTX *x509_ctx)

{
  SSL *ctx;
  int iVar1;
  X509 *x509;
  X509 *topcert;
  lws_tls_cert_info_results ir;
  lws *wsi;
  SSL *pSStack_20;
  int n;
  SSL *ssl;
  X509_STORE_CTX *x509_ctx_local;
  int preverify_ok_local;
  
  ssl = (SSL *)x509_ctx;
  x509_ctx_local._4_4_ = preverify_ok;
  x509 = X509_STORE_CTX_get_current_cert((X509_STORE_CTX *)x509_ctx);
  ctx = ssl;
  iVar1 = SSL_get_ex_data_X509_STORE_CTX_idx();
  pSStack_20 = (SSL *)X509_STORE_CTX_get_ex_data((X509_STORE_CTX *)ctx,iVar1);
  ir._64_8_ = SSL_get_ex_data(pSStack_20,openssl_websocket_private_data_index);
  wsi._4_4_ = lws_tls_openssl_cert_info
                        ((X509 *)x509,LWS_TLS_CERT_INFO_COMMON_NAME,
                         (lws_tls_cert_info_results *)&topcert,0x40);
  if (wsi._4_4_ == 0) {
    _lws_log(8,"%s: client cert CN \'%s\'\n","OpenSSL_verify_callback",(long)&topcert + 4);
  }
  else {
    _lws_log(8,"%s: couldn\'t get client cert CN\n","OpenSSL_verify_callback");
  }
  iVar1 = (**(code **)(*(long *)(*(long *)(ir._64_8_ + 8) + 0x248) + 8))
                    (ir._64_8_,0x17,ssl,pSStack_20,x509_ctx_local._4_4_);
  return (int)((iVar1 != 0 ^ 0xffU) & 1);
}

Assistant:

static int
OpenSSL_verify_callback(int preverify_ok, X509_STORE_CTX *x509_ctx)
{
	SSL *ssl;
	int n;
	struct lws *wsi;
	union lws_tls_cert_info_results ir;
	X509 *topcert = X509_STORE_CTX_get_current_cert(x509_ctx);

	ssl = X509_STORE_CTX_get_ex_data(x509_ctx,
		SSL_get_ex_data_X509_STORE_CTX_idx());

	/*
	 * !!! nasty openssl requires the index to come as a library-scope
	 * static
	 */
	wsi = SSL_get_ex_data(ssl, openssl_websocket_private_data_index);

	n = lws_tls_openssl_cert_info(topcert, LWS_TLS_CERT_INFO_COMMON_NAME,
				      &ir, sizeof(ir.ns.name));
	if (!n)
		lwsl_info("%s: client cert CN '%s'\n", __func__, ir.ns.name);
	else
		lwsl_info("%s: couldn't get client cert CN\n", __func__);

	n = wsi->a.vhost->protocols[0].callback(wsi,
			LWS_CALLBACK_OPENSSL_PERFORM_CLIENT_CERT_VERIFICATION,
					   x509_ctx, ssl, (unsigned int)preverify_ok);

	/* convert return code from 0 = OK to 1 = OK */
	return !n;
}